

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessage
          (ParserImpl *this,Message *message,string *delimiter)

{
  string *__lhs;
  __type _Var1;
  bool bVar2;
  allocator<char> local_7a;
  allocator<char> local_79;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __lhs = &(this->tokenizer_).current_.text;
  local_78 = delimiter;
  while( true ) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,">",&local_79);
    _Var1 = std::operator==(__lhs,&local_70);
    if (_Var1) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"}",&local_7a);
    _Var1 = std::operator==(__lhs,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (_Var1) goto LAB_002b0ca0;
    bVar2 = ConsumeField(this,message);
    if (!bVar2) {
      return false;
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
LAB_002b0ca0:
  bVar2 = Consume(this,local_78);
  return bVar2;
}

Assistant:

bool ConsumeMessage(Message* message, const std::string& delimiter) {
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(ConsumeField(message));
    }

    // Confirm that we have a valid ending delimiter.
    DO(Consume(delimiter));
    return true;
  }